

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

void __thiscall Block::toString(Block *this)

{
  bool bVar1;
  reference pRVar2;
  ostream *poVar3;
  undefined1 local_50 [8];
  Record r;
  iterator __end1;
  iterator __begin1;
  vector<Record,_std::allocator<Record>_> *__range1;
  Block *this_local;
  
  __end1 = std::vector<Record,_std::allocator<Record>_>::begin(&this->records);
  r._32_8_ = std::vector<Record,_std::allocator<Record>_>::end(&this->records);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>
                                *)&r.averageRating);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>::
             operator*(&__end1);
    Record::Record((Record *)local_50,pRVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_50);
    std::operator<<(poVar3," ,");
    Record::~Record((Record *)local_50);
    __gnu_cxx::__normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>::
    operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Block::toString() {
    for (Record r : records) {
        std::cout << r.tconst << " ,";
    }
    std::cout << std::endl;
}